

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O2

int ngp_set_extver(char *extname,int version)

{
  ulong uVar1;
  int iVar2;
  NGP_EXTVER_TAB *pNVar3;
  size_t sVar4;
  char *__dest;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  pNVar3 = ngp_extver_tab;
  iVar2 = 0x170;
  if (((extname != (char *)0x0) &&
      (ngp_extver_tab != (NGP_EXTVER_TAB *)0x0 || ngp_extver_tab_size < 1)) &&
     (lVar6 = (long)ngp_extver_tab_size,
     ngp_extver_tab == (NGP_EXTVER_TAB *)0x0 || 0 < ngp_extver_tab_size)) {
    uVar7 = (ulong)(uint)ngp_extver_tab_size;
    if (ngp_extver_tab_size < 1) {
      uVar7 = 0;
    }
    uVar1 = 0;
    do {
      uVar5 = uVar1;
      if (uVar7 * 0x10 + 0x10 == uVar5 + 0x10) {
        if (pNVar3 == (NGP_EXTVER_TAB *)0x0) {
          pNVar3 = (NGP_EXTVER_TAB *)malloc(0x10);
        }
        else {
          pNVar3 = (NGP_EXTVER_TAB *)realloc(pNVar3,lVar6 * 0x10 + 0x10);
        }
        if (pNVar3 == (NGP_EXTVER_TAB *)0x0) {
          return 0x168;
        }
        sVar4 = strlen(extname);
        __dest = (char *)malloc(sVar4 + 1);
        if (__dest != (char *)0x0) {
          strcpy(__dest,extname);
          ngp_extver_tab = pNVar3;
          pNVar3[ngp_extver_tab_size].extname = __dest;
          pNVar3[ngp_extver_tab_size].version = version;
          ngp_extver_tab_size = ngp_extver_tab_size + 1;
          return 0;
        }
        free(pNVar3);
        return 0x168;
      }
      iVar2 = strcmp(extname,*(char **)((long)&pNVar3->extname + uVar5));
      uVar1 = uVar5 + 0x10;
    } while (iVar2 != 0);
    iVar2 = 0;
    if (*(int *)((long)&pNVar3->version + uVar5) < version) {
      *(int *)((long)&pNVar3->version + uVar5) = version;
    }
  }
  return iVar2;
}

Assistant:

int	ngp_set_extver(char *extname, int version)
 { NGP_EXTVER_TAB *p;
   char 	*p2;
   int		i;

   if (NULL == extname) return(NGP_BAD_ARG);
   if ((NULL == ngp_extver_tab) && (ngp_extver_tab_size > 0)) return(NGP_BAD_ARG);
   if ((NULL != ngp_extver_tab) && (ngp_extver_tab_size <= 0)) return(NGP_BAD_ARG);

   for (i=0; i<ngp_extver_tab_size; i++)
    { if (0 == strcmp(extname, ngp_extver_tab[i].extname))
        { if (version > ngp_extver_tab[i].version)  ngp_extver_tab[i].version = version;
          return(NGP_OK);
        }
    }

   if (NULL == ngp_extver_tab)
     { p = (NGP_EXTVER_TAB *)ngp_alloc(sizeof(NGP_EXTVER_TAB)); }
   else
     { p = (NGP_EXTVER_TAB *)ngp_realloc(ngp_extver_tab, (ngp_extver_tab_size + 1) * sizeof(NGP_EXTVER_TAB)); }

   if (NULL == p) return(NGP_NO_MEMORY);

   p2 = ngp_alloc(strlen(extname) + 1);
   if (NULL == p2)
     { ngp_free(p);
       return(NGP_NO_MEMORY);
     }

   strcpy(p2, extname);
   ngp_extver_tab = p;
   ngp_extver_tab[ngp_extver_tab_size].extname = p2;
   ngp_extver_tab[ngp_extver_tab_size].version = version;

   ngp_extver_tab_size++;

   return(NGP_OK);
 }